

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMath.cpp
# Opt level: O0

size_t adios2::helper::NextExponentialSize
                 (size_t requiredSize,size_t currentSize,float growthFactor)

{
  ulong in_RSI;
  ulong in_RDI;
  float in_XMM0_Da;
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  size_t nextExponentialSize;
  double n;
  double denominator;
  double numerator;
  double growthFactorDouble;
  ulong local_8;
  undefined4 uVar6;
  
  local_8 = in_RDI;
  if ((in_RSI != 0) && (local_8 = in_RSI, in_RSI < in_RDI)) {
    auVar3._8_4_ = (int)(in_RDI >> 0x20);
    auVar3._0_8_ = in_RDI;
    auVar3._12_4_ = 0x45300000;
    uVar6 = (undefined4)(in_RSI >> 0x20);
    auVar4._8_4_ = uVar6;
    auVar4._0_8_ = in_RSI;
    auVar4._12_4_ = 0x45300000;
    dVar1 = log(((auVar3._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)in_RDI) - 4503599627370496.0)) /
                ((auVar4._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)in_RSI) - 4503599627370496.0)));
    dVar2 = log((double)in_XMM0_Da);
    dVar1 = ceil(dVar1 / dVar2);
    dVar1 = pow((double)in_XMM0_Da,dVar1);
    auVar5._8_4_ = uVar6;
    auVar5._0_8_ = in_RSI;
    auVar5._12_4_ = 0x45300000;
    dVar1 = ceil(dVar1 * ((auVar5._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)in_RSI) - 4503599627370496.0)));
    local_8 = (long)dVar1 | (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f;
  }
  return local_8;
}

Assistant:

size_t NextExponentialSize(const size_t requiredSize, const size_t currentSize,
                           const float growthFactor) noexcept
{
    if (currentSize == 0)
    {
        return requiredSize;
    }
    if (currentSize >= requiredSize)
    {
        return currentSize;
    }

    const double growthFactorDouble = static_cast<double>(growthFactor);

    const double numerator =
        std::log(static_cast<double>(requiredSize) / static_cast<double>(currentSize));
    const double denominator = std::log(growthFactorDouble);
    const double n = std::ceil(numerator / denominator);

    const size_t nextExponentialSize =
        static_cast<size_t>(std::ceil(std::pow(growthFactorDouble, n) * currentSize));

    return nextExponentialSize;
}